

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_list_iterator.cpp
# Opt level: O0

int main(void)

{
  List<Employee_*> *pLVar1;
  undefined1 local_60 [8];
  PrintNEmployees pa;
  Employee *local_30;
  Employee *local_28 [3];
  List<Employee_*> *local_10;
  List<Employee_*> *employees;
  
  pLVar1 = (List<Employee_*> *)operator_new(0x18);
  List<Employee_*>::List(pLVar1,200);
  local_10 = pLVar1;
  local_28[0] = (Employee *)operator_new(1);
  List<Employee_*>::Append(pLVar1,local_28);
  pLVar1 = local_10;
  local_30 = (Employee *)operator_new(1);
  List<Employee_*>::Append(pLVar1,&local_30);
  pLVar1 = local_10;
  pa._32_8_ = operator_new(1);
  List<Employee_*>::Append(pLVar1,(Employee **)&pa._total);
  PrintNEmployees::PrintNEmployees((PrintNEmployees *)local_60,local_10,10);
  ListTraverser<Employee_*>::Traverse((ListTraverser<Employee_*> *)local_60);
  return 0;
}

Assistant:

int main()
{
    List<Employee*>* employees;

    employees = new List<Employee*>;
    employees->Append(new Employee);
    employees->Append(new Employee);
    employees->Append(new Employee);

    PrintNEmployees pa(employees, 10);
    pa.Traverse();
}